

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.cpp
# Opt level: O2

void __thiscall
LiteScript::_Type_CALLBACK::Save
          (_Type_CALLBACK *this,ostream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  Callback *this_00;
  bool bVar1;
  long lVar2;
  OStreamer *this_01;
  Object *pOVar3;
  offset_in_Memory_to_subr in_R8;
  long *plVar4;
  code *pcVar5;
  OStreamer streamer;
  
  this_00 = (Callback *)object->data;
  streamer.stream = stream;
  bVar1 = Callback::isInternal(this_00);
  if (bVar1) {
    std::operator<<(stream,'\0');
    this_01 = &streamer;
    lVar2 = 0xa8;
  }
  else {
    std::operator<<(stream,'\x01');
    this_01 = OStreamer::operator<<(&streamer,this_00->I);
    lVar2 = 0xa0;
  }
  OStreamer::operator<<
            (this_01,*(uint **)((long)&((Callback *)(&this_00->This + -1))->intrl_idx + lVar2));
  if (*(this_00->This).isNull == true) {
    std::operator<<(streamer.stream,'\0');
  }
  else {
    std::operator<<(streamer.stream,'\x01');
    plVar4 = (long *)((long)(object->memory->arr)._M_elems + in_R8);
    pcVar5 = (code *)caller;
    if ((caller & 1) != 0) {
      pcVar5 = *(code **)(*plVar4 + -1 + caller);
    }
    pOVar3 = Variable::operator->((Variable *)&this_00->This);
    (*pcVar5)(plVar4,stream,pOVar3->ID);
  }
  if (*(this_00->nsp).isNull == true) {
    std::operator<<(streamer.stream,'\0');
  }
  else {
    std::operator<<(streamer.stream,'\x01');
    Namer::Save((Namer *)stream,(ostream *)&this_00->nsp,(Namer *)caller,in_R8);
  }
  return;
}

Assistant:

void LiteScript::_Type_CALLBACK::Save(std::ostream &stream, Object &object, bool (Memory::*caller)(std::ostream&, unsigned int)) const {
    Callback& C = object.GetData<Callback>();
    OStreamer streamer(stream);
    if (C.isInternal())
        streamer << (unsigned char)0 << C.CallbackIndex;
    else
        streamer << (unsigned char)1 << C.I << C.L;
    if (C.This.isNull)
        streamer << (unsigned char)0;
    else {
        streamer << (unsigned char) 1;
        (object.memory.*caller)(stream, (*C.This)->ID);
    }
    if (C.nsp.isNull)
        streamer << (unsigned char)0;
    else {
        streamer << (unsigned char) 1;
        Namer::Save(stream, *C.nsp, caller);
    }
}